

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNSymBase::adjust_for_dyn(CTPNSymBase *this,tcpn_dyncomp_info *param_2)

{
  CTcSymbol *pCVar1;
  CTcPrsSymtab *in_RSI;
  CTcPrsNode *in_RDI;
  
  CTcParser::get_global_symtab(G_prs);
  pCVar1 = CTcPrsSymtab::find(in_RSI,(textchar_t *)in_RDI,0x2ad8ea);
  if (pCVar1 == (CTcSymbol *)0x0) {
    CTcTokenizer::log_error
              (0x2b18,(ulong)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xffffffff,
               in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
    err_throw_a(0x2b18,2,0,in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,2,
                in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNSymBase::adjust_for_dyn(const tcpn_dyncomp_info *)
{
    /* 
     *   If this symbol isn't defined in the global symbol table, we can't
     *   evaluate this expression in the debugger - new symbols can never
     *   be defined in the debugger, so there's no point in trying to hold
     *   a forward reference as we normally would for an undefined symbol.
     *   We need look only in the global symbol table because local
     *   symbols will already have been resolved.  
     */
    if (G_prs->get_global_symtab()->find(sym_, len_) == 0)
    {
        /* log the error, to generate an appropriate message */
        G_tok->log_error(TCERR_UNDEF_SYM, (int)len_, sym_);
        
        /* throw the error as well */
        err_throw_a(TCERR_UNDEF_SYM, 2,
                    ERR_TYPE_INT, (int)len_, ERR_TYPE_TEXTCHAR, sym_);
    }
    
    /* return myself unchanged */
    return this;
}